

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

void __thiscall
cmDependsFortran::ConsiderModule(cmDependsFortran *this,string *name,string *stampDir)

{
  iterator iVar1;
  string stampFile;
  string local_40 [32];
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->Internal->TargetRequires)._M_t,name);
  if (((_Rb_tree_header *)iVar1._M_node !=
       &(this->Internal->TargetRequires)._M_t._M_impl.super__Rb_tree_header) &&
     (iVar1._M_node[2]._M_parent == (_Base_ptr)0x0)) {
    std::__cxx11::string::string(local_40,(string *)stampDir);
    std::__cxx11::string::append((char *)local_40);
    std::__cxx11::string::append(local_40);
    std::__cxx11::string::append((char *)local_40);
    std::__cxx11::string::_M_assign((string *)(iVar1._M_node + 2));
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void cmDependsFortran::ConsiderModule(const std::string& name,
                                      const std::string& stampDir)
{
  // Locate each required module.
  typedef cmDependsFortranInternals::TargetRequiresMap TargetRequiresMap;
  TargetRequiresMap::iterator required =
    this->Internal->TargetRequires.find(name);
  if (required != this->Internal->TargetRequires.end() &&
      required->second.empty()) {
    // The module is provided by a CMake target.  It will have a stamp file.
    std::string stampFile = stampDir;
    stampFile += "/";
    stampFile += name;
    stampFile += ".stamp";
    required->second = stampFile;
  }
}